

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_specialpaths.cpp
# Opt level: O2

FString M_GetCajunPath(char *botfilename)

{
  bool bVar1;
  char *in_RSI;
  FString FStack_18;
  
  botfilename[0] = -0x14;
  botfilename[1] = -0x22;
  botfilename[2] = 'q';
  botfilename[3] = '\0';
  botfilename[4] = '\0';
  botfilename[5] = '\0';
  botfilename[6] = '\0';
  botfilename[7] = '\0';
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  GetUserFile((char *)&FStack_18);
  FString::operator=((FString *)botfilename,&FStack_18);
  FString::~FString(&FStack_18);
  bVar1 = FileExists(*(char **)botfilename);
  if (!bVar1) {
    FString::operator=((FString *)botfilename,"/usr/local/share/");
    FString::operator+=((FString *)botfilename,in_RSI);
    bVar1 = FileExists(*(char **)botfilename);
    if (!bVar1) {
      FString::operator=((FString *)botfilename,(char *)"");
    }
  }
  return (FString)botfilename;
}

Assistant:

FString M_GetCajunPath(const char *botfilename)
{
	FString path;

	// Check first in ~/.config/zdoom/botfilename.
	path = GetUserFile(botfilename);
	if (!FileExists(path))
	{
		// Then check in SHARE_DIR/botfilename.
		path = SHARE_DIR;
		path << botfilename;
		if (!FileExists(path))
		{
			path = "";
		}
	}
	return path;
}